

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

void drawText(undefined8 *windows,undefined4 param_2)

{
  int iVar1;
  long lVar2;
  int xOff;
  int yOff;
  int i;
  int height;
  char new [25];
  int *piStack_20;
  char current;
  char *target;
  GameMode gameMode_local;
  Windows *windows_local;
  
  piStack_20 = (int *)0x0;
  builtin_strncpy(new + 8,"ame text",9);
  i._0_1_ = 'P';
  i._1_1_ = 'l';
  i._2_1_ = 'a';
  i._3_1_ = 'c';
  height._0_1_ = 'e';
  height._1_1_ = 'h';
  height._2_1_ = 'o';
  height._3_1_ = 'l';
  builtin_strncpy(new,"der newg",8);
  yOff = 0;
  xOff = 1;
  switch(param_2) {
  case 99:
    piStack_20 = (int *)&stack0x00000008;
    break;
  case 100:
    piStack_20 = (int *)&stack0x000001fc;
    break;
  case 0x65:
    piStack_20 = (int *)&stack0x000003f0;
    break;
  default:
    quit("Simulation terminated with unknown condition");
    break;
  case 0x6e:
    yOff = 1;
    piStack_20 = &i;
  }
  wclear(*windows);
  wborder(*windows,0,0,0,0);
  iVar1 = wmove(*windows,2,4);
  if (iVar1 != -1) {
    waddnstr(*windows,"Level x: Title",0xffffffff);
  }
  iVar1 = wmove(*windows,2,0x31);
  if (iVar1 != -1) {
    waddnstr(*windows,"Press any key to continue...",0xffffffff);
  }
  wrefresh(*windows);
  while( true ) {
    iVar1 = xOff + 1;
    lVar2 = (long)xOff;
    if (*(char *)((long)piStack_20 + lVar2) == '\0') break;
    xOff = iVar1;
    if (*(char *)((long)piStack_20 + lVar2) == '\n') {
      yOff = yOff + 1;
    }
  }
  if (0x18 < yOff) {
    quit("Too much text in current dialogue entry");
  }
  wresize(*windows,yOff,0x49);
  mvwin(*windows,0xc - yOff / 2,4);
  wclear(*windows);
  iVar1 = wmove(*windows,0);
  if (iVar1 != -1) {
    waddnstr(*windows,piStack_20,0xffffffff);
  }
  wrefresh(*windows);
  getchar();
  wresize(*windows,0x18,0x50);
  mvwin(*windows,0);
  return;
}

Assistant:

void drawText(struct Windows *windows, struct Dialog dialog,
    enum GameMode gameMode) {
    char *target = NULL;
    char current;
    char new[] = "Placeholder newgame text"; //TODO revise
    int height = 0;
    int i = 1;
    int yOff, xOff;

    /* Get dialogue text field */
    switch (gameMode) {
        case NEW:
            target = new;
            height=1;
            break;
        case CONTINUE:
            target = dialog.textIntro;
            break;
        case WIN:
            target = dialog.textWin;
            break;
        case LOSE:
            target = dialog.textLose;
            break;
        default:
            quit("Simulation terminated with unknown condition");
    }

    xOff = MAX_COLS / 2 - MAP_COLS / 2;

    /* Print borders and static text */
    wclear(windows->menu);
    box(windows->menu, 0, 0);
    mvwaddstr(windows->menu,2,xOff,"Level x: Title"); //TODO revise
    mvwaddstr(windows->menu,2,MAX_COLS-27-xOff,"Press any key to continue...");


    wrefresh(windows->menu);

    /* Determine text height based on newline count */
    while ((current = target[i++]) != '\0')
        if (current == '\n')height++;
    if (height > MAX_ROWS) quit("Too much text in current dialogue entry");

    yOff = MAX_ROWS / 2 - height / 2;

    /* Resize window (temporarily)*/
    wresize(windows->menu, height, MAP_COLS + 1); // +1 for newline
    mvwin(windows->menu, yOff, xOff);
    wclear(windows->menu);


    /* Printout to screen */
    mvwaddstr(windows->menu,0,0, target);
    wrefresh(windows->menu);

    /* Wait for user input to continue */
    getchar();

    /* Restore window dimensions */
    wresize(windows->menu, MAX_ROWS, MAX_COLS);
    mvwin(windows->menu, 0, 0);
}